

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IterativeAlgorithm.cpp
# Opt level: O2

void __thiscall
van_kampen::IterativeAlgorithm::generate
          (IterativeAlgorithm *this,
          vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
          *words_)

{
  ulong uVar1;
  ulong __n;
  size_t sVar2;
  ostream *poVar3;
  ulong total;
  bool isAdditionForced;
  long local_118;
  size_t totalIterations;
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  words;
  vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> local_f0;
  anon_class_56_7_b2ce0729 iterateOverWordsOnce;
  vector<bool,_std::allocator<bool>_> isAdded;
  ProcessLogger logger;
  
  std::
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  ::vector(&words,words_);
  std::
  __reverse<__gnu_cxx::__normal_iterator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>*,std::vector<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>,std::allocator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>>>>
            (words.
             super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             words.
             super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  __n = ((long)words.
               super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)words.
              super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  uVar1 = this->cellsLimit;
  total = __n;
  if ((uVar1 != 0) && (uVar1 < __n)) {
    total = uVar1;
  }
  totalIterations = total;
  std::vector<bool,_std::allocator<bool>_>::vector(&isAdded,__n,(allocator_type *)&logger);
  isAdditionForced = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iterateOverWordsOnce,"Relations used",(allocator<char> *)&local_118);
  ProcessLogger::ProcessLogger
            (&logger,total,(ostream *)&std::clog,(string *)&iterateOverWordsOnce,this->quiet);
  std::__cxx11::string::~string((string *)&iterateOverWordsOnce);
  *isAdded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
   super__Bit_iterator_base._M_p =
       *isAdded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
        .super__Bit_iterator_base._M_p | 1;
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::vector
            (&local_f0,
             words.
             super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  Diagramm::bindWord(&this->diagramm_,&local_f0,false,true);
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::~vector
            (&local_f0);
  ProcessLogger::iterate(&logger);
  iterateOverWordsOnce.totalIterations = &totalIterations;
  iterateOverWordsOnce.isAdditionForced = &isAdditionForced;
  local_118 = 1;
  iterateOverWordsOnce.words = &words;
  iterateOverWordsOnce.logger = &logger;
  iterateOverWordsOnce.isAdded = &isAdded;
  iterateOverWordsOnce.this = this;
  iterateOverWordsOnce.increase = (size_t *)&local_118;
  while (local_118 != 0) {
    local_118 = 0;
    generate::anon_class_56_7_b2ce0729::operator()(&iterateOverWordsOnce);
  }
  isAdditionForced = true;
  local_118 = 1;
  while (local_118 != 0) {
    local_118 = 0;
    generate::anon_class_56_7_b2ce0729::operator()(&iterateOverWordsOnce);
  }
  sVar2 = ProcessLogger::getIteration(&logger);
  if ((sVar2 < totalIterations) && (this->quiet == false)) {
    poVar3 = std::operator<<((ostream *)&std::clog,"can not bind ");
    ProcessLogger::getIteration(&logger);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3," relations, finishing");
  }
  ProcessLogger::~ProcessLogger(&logger);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&isAdded.super__Bvector_base<std::allocator<bool>_>);
  std::
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  ::~vector(&words);
  return;
}

Assistant:

void IterativeAlgorithm::generate(const std::vector<std::vector<GroupElement>> &words_)
{
    auto words = words_;
    std::reverse(words.begin(), words.end());
    std::size_t totalIterations = words.size();
    if (cellsLimit)
    {
        totalIterations = std::min(totalIterations, cellsLimit);
    }
    std::vector<bool> isAdded(words.size());
    bool isAdditionForced = false;
    ProcessLogger logger(totalIterations, std::clog, "Relations used", quiet);
    std::size_t increase = 0;
    isAdded.front() = true;
    diagramm_.bindWord(words.front(), false, true);
    logger.iterate();
    auto iterateOverWordsOnce = [&]() {
        for (std::size_t i = 0; i < words.size(); ++i)
        {
            if (logger.getIteration() >= totalIterations)
            {
                break;
            }
            if (isAdded[i])
                continue;
            if (diagramm_.bindWord(words[i], isAdditionForced, false))
            {
                isAdded[i] = true;
                increase += 1;
                if (logger.iterate() >= totalIterations)
                {
                    break;
                }
            }
        }
    };
    increase = 1;
    while (increase)
    {
        increase = 0;
        iterateOverWordsOnce();
    }
    isAdditionForced = true;
    increase = 1;
    while (increase)
    {
        increase = 0;
        iterateOverWordsOnce();
    }
    if (logger.getIteration() < totalIterations && !quiet)
    {
        std::clog << "can not bind " << totalIterations - logger.getIteration() << " relations, finishing";
    }
}